

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O2

int arkode_butcher_order6i
              (sunrealtype *b,sunrealtype *c1,sunrealtype **A1,sunrealtype **A2,sunrealtype *c2,
              sunrealtype *c3,int s)

{
  int iVar1;
  sunrealtype *z;
  sunrealtype *b_00;
  sunrealtype bcAAcc;
  
  z = (sunrealtype *)calloc((long)s,8);
  b_00 = (sunrealtype *)calloc((long)s,8);
  iVar1 = arkode_butcher_vv(c2,c3,s,z);
  if ((((iVar1 == 0) && (iVar1 = arkode_butcher_mv(A2,z,s,b_00), iVar1 == 0)) &&
      (iVar1 = arkode_butcher_mv(A1,b_00,s,z), iVar1 == 0)) &&
     (iVar1 = arkode_butcher_vv(c1,z,s,b_00), iVar1 == 0)) {
    iVar1 = arkode_butcher_dot(b,b_00,s,&bcAAcc);
    if (iVar1 != 0) {
      return 0;
    }
    free(z);
    free(b_00);
    return (uint)(ABS(bcAAcc + -0.013888888888888888) <= 1.4901161193847656e-08);
  }
  free(z);
  free(b_00);
  return 0;
}

Assistant:

static sunbooleantype arkode_butcher_order6i(sunrealtype* b, sunrealtype* c1,
                                             sunrealtype** A1, sunrealtype** A2,
                                             sunrealtype* c2, sunrealtype* c3,
                                             int s)
{
  sunrealtype bcAAcc;
  sunrealtype* tmp1 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp2 = calloc(s, sizeof(sunrealtype));
  if (arkode_butcher_vv(c2, c3, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A2, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A1, tmp2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(c1, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_dot(b, tmp2, s, &bcAAcc)) { return (SUNFALSE); }
  free(tmp1);
  free(tmp2);
  return (SUNRabs(bcAAcc - SUN_RCONST(1.0) / SUN_RCONST(72.0)) > TOL) ? SUNFALSE
                                                                      : SUNTRUE;
}